

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlResponse.h
# Opt level: O0

string * __thiscall
io::aeron::archive::codecs::ControlResponse::getErrorMessageAsString_abi_cxx11_
          (string *__return_storage_ptr__,ControlResponse *this)

{
  uint64_t uVar1;
  char *pcVar2;
  allocator local_42;
  undefined1 local_41;
  uint64_t local_40;
  uint64_t pos;
  uint64_t dataLength;
  uint64_t uStack_28;
  uint32_t lengthFieldValue;
  uint64_t lengthPosition;
  uint64_t lengthOfLengthField;
  ControlResponse *this_local;
  string *result;
  
  lengthPosition = 4;
  lengthOfLengthField = (uint64_t)this;
  this_local = (ControlResponse *)__return_storage_ptr__;
  uStack_28 = sbePosition(this);
  sbePosition(this,uStack_28 + lengthPosition);
  dataLength._4_4_ = *(uint *)(this->m_buffer + uStack_28);
  pos = (uint64_t)dataLength._4_4_;
  local_40 = sbePosition(this);
  uVar1 = pos;
  local_41 = 0;
  pcVar2 = this->m_buffer + local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,uVar1,&local_42);
  std::allocator<char>::~allocator((allocator<char> *)&local_42);
  sbePosition(this,local_40 + pos);
  return __return_storage_ptr__;
}

Assistant:

const std::string getErrorMessageAsString()
    {
        std::uint64_t lengthOfLengthField = 4;
        std::uint64_t lengthPosition = sbePosition();
        sbePosition(lengthPosition + lengthOfLengthField);
        std::uint32_t lengthFieldValue;
        std::memcpy(&lengthFieldValue, m_buffer + lengthPosition, sizeof(std::uint32_t));
        std::uint64_t dataLength = SBE_LITTLE_ENDIAN_ENCODE_32(lengthFieldValue);
        std::uint64_t pos = sbePosition();
        const std::string result(m_buffer + pos, dataLength);
        sbePosition(pos + dataLength);
        return result;
    }